

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

ptrlen ntru_decode_pubkey(uint16_t *pubkey,uint p,uint q,BinarySource *src)

{
  NTRUEncodeSchedule *sched;
  size_t wanted;
  ptrlen data;
  
  sched = ntru_encode_pubkey_schedule(p,q);
  wanted = ntru_encode_schedule_length(sched);
  data = BinarySource_get_data(src->binarysource_,wanted);
  if (src->binarysource_->err == BSE_NO_ERROR) {
    ntru_decode(sched,pubkey,data);
    ntru_encode_schedule_free(sched);
    ntru_bias(pubkey,pubkey,q - (q >> 1),p,q);
  }
  else {
    memset(pubkey,0,(ulong)p * 2);
  }
  return data;
}

Assistant:

ptrlen ntru_decode_pubkey(uint16_t *pubkey, unsigned p, unsigned q,
                          BinarySource *src)
{
    NTRUEncodeSchedule *sched = ntru_encode_pubkey_schedule(p, q);

    /* Retrieve the right number of bytes from the source */
    size_t len = ntru_encode_schedule_length(sched);
    ptrlen encoded = get_data(src, len);
    if (get_err(src)) {
        /* If there wasn't enough data, give up and return all-zeroes
         * purely for determinism. But that value should never be
         * used, because the caller will also check get_err(src). */
        memset(pubkey, 0, p*sizeof(*pubkey));
    } else {
        /* Do the decoding */
        ntru_decode(sched, pubkey, encoded);
        ntru_encode_schedule_free(sched);

        /* Unbias the coefficients */
        ntru_bias(pubkey, pubkey, q-q/2, p, q);
    }

    return encoded;
}